

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_helpers.h
# Opt level: O2

int test_helper_is_psa_pristine(int line,char *file)

{
  char *pcVar1;
  mbedtls_psa_stats_t stats;
  
  mbedtls_psa_get_stats(&stats);
  if (stats.volatile_slots == 0) {
    if (stats.persistent_slots == 0) {
      if (stats.external_slots == 0) {
        if (stats.half_filled_slots == 0) {
          return 1;
        }
        pcVar1 = "A half-filled slot has not been cleared properly.";
      }
      else {
        pcVar1 = "An external slot has not been closed properly.";
      }
    }
    else {
      pcVar1 = "A persistent slot has not been closed properly.";
    }
  }
  else {
    pcVar1 = "A volatile slot has not been closed properly.";
  }
  if (test_info.result == TEST_RESULT_SUCCESS) {
    test_info.result = TEST_RESULT_FAILED;
    test_info.filename =
         "/workspace/llm4binary/github/license_c_cmakelists/ARMmbed[P]mbed-crypto/tests/suites/test_suite_psa_crypto_slot_management.function"
    ;
    test_info.test = pcVar1;
    test_info.line_no = line;
  }
  return 0;
}

Assistant:

static int test_helper_is_psa_pristine( int line, const char *file )
{
    mbedtls_psa_stats_t stats;
    const char *msg = NULL;

    mbedtls_psa_get_stats( &stats );

    if( stats.volatile_slots != 0 )
        msg = "A volatile slot has not been closed properly.";
    else if( stats.persistent_slots != 0 )
        msg = "A persistent slot has not been closed properly.";
    else if( stats.external_slots != 0 )
        msg = "An external slot has not been closed properly.";
    else if( stats.half_filled_slots != 0 )
        msg = "A half-filled slot has not been cleared properly.";

    /* If the test has already failed, don't overwrite the failure
     * information. Do keep the stats lookup above, because it can be
     * convenient to break on it when debugging a failure. */
    if( msg != NULL && test_info.result == TEST_RESULT_SUCCESS )
        test_fail( msg, line, file );

    return( msg == NULL );
}